

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v7::detail::fallback_format<double>
               (double d,int num_digits,bool binary32,buffer<char> *buf,int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  bigint *lhs2;
  uint64_t value;
  ulong uVar10;
  uint uVar11;
  undefined7 in_register_00000031;
  bool bVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  float fVar16;
  bigint denominator;
  bigint numerator;
  bigint lower;
  bigint upper_store;
  bigint *local_338;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  uVar9 = (ulong)(uint)num_digits;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00149528;
  puVar1 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00149528;
  puVar2 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00149528;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  local_338 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_00149528;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if ((int)CONCAT71(in_register_00000031,binary32) == 0) {
    uVar13 = (ulong)d & 0xfffffffffffff;
    uVar11 = (uint)((ulong)d >> 0x34) & 0x7ff;
    bVar12 = 1 < uVar11 && uVar13 == 0;
    if (uVar11 == 0) {
      iVar7 = -0x432;
      goto LAB_0011b5f9;
    }
    iVar7 = uVar11 - 0x433;
    uVar13 = uVar13 + 0x10000000000000;
LAB_0011b566:
    iVar15 = bVar12 + 1;
    value = uVar13 << (sbyte)iVar15;
    if (iVar7 < 0) goto LAB_0011b609;
    bigint::assign(&local_240,value);
    bigint::operator<<=(&local_240,iVar7);
    bigint::assign(&local_190,1);
    bigint::operator<<=(&local_190,iVar7);
    if (bVar12 == false) {
      local_338 = (bigint *)0x0;
    }
    else {
      local_338 = &local_e0;
      bigint::assign(local_338,1);
      bigint::operator<<=(&local_e0,iVar7 + 1);
    }
    bigint::assign_pow10(&local_2f0,*exp10);
    bigint::operator<<=(&local_2f0,iVar15);
  }
  else {
    fVar16 = (float)d;
    uVar13 = (ulong)((uint)fVar16 & 0x7fffff);
    bVar12 = 0xffffff < (uint)fVar16 && ((uint)fVar16 & 0x7fffff) == 0;
    iVar7 = -0x95;
    if (0x7fffff < (uint)fVar16) {
      uVar13 = uVar13 | 0x800000;
      iVar7 = ((uint)fVar16 >> 0x17) - 0x96;
      goto LAB_0011b566;
    }
LAB_0011b5f9:
    iVar15 = bVar12 + 1;
    value = uVar13 << (sbyte)iVar15;
LAB_0011b609:
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_240,-*exp10);
      bigint::assign(&local_190,&local_240);
      if (bVar12 == false) {
        local_338 = (bigint *)0x0;
      }
      else {
        local_338 = &local_e0;
        bigint::assign(local_338,&local_240);
        bigint::operator<<=(&local_e0,1);
      }
      bigint::multiply(&local_240,value);
      bigint::assign(&local_2f0,1);
      bigint::operator<<=(&local_2f0,iVar15 - iVar7);
    }
    else {
      bigint::assign(&local_240,value);
      bigint::assign_pow10(&local_2f0,*exp10);
      bigint::operator<<=(&local_2f0,iVar15 - iVar7);
      bigint::assign(&local_190,1);
      if (bVar12 == false) {
        local_338 = (bigint *)0x0;
      }
      else {
        bigint::assign(&local_e0,2);
      }
    }
  }
  if (-1 < num_digits) {
    *exp10 = *exp10 - (num_digits + -1);
    uVar11 = num_digits - 1;
    if (num_digits == 0) {
      uVar9 = 1;
      if (buf->capacity_ == 0) {
        (**buf->_vptr_buffer)(buf,1);
        uVar9 = (ulong)(buf->capacity_ != 0);
      }
      buf->size_ = uVar9;
      bigint::multiply(&local_2f0,10);
      iVar7 = add_compare(&local_240,&local_240,&local_2f0);
      *buf->ptr_ = 0 < iVar7 | 0x30;
    }
    else {
      uVar10 = (ulong)(uint)num_digits;
      uVar13 = buf->capacity_;
      if (uVar13 < uVar10) {
        (**buf->_vptr_buffer)(buf,uVar10);
        uVar13 = buf->capacity_;
      }
      if (uVar13 < uVar10) {
        uVar10 = uVar13;
      }
      buf->size_ = uVar10;
      if (num_digits != 1) {
        uVar13 = 0;
        do {
          iVar7 = bigint::divmod_assign(&local_240,&local_2f0);
          buf->ptr_[uVar13] = (char)iVar7 + '0';
          bigint::multiply(&local_240,10);
          uVar13 = uVar13 + 1;
        } while (uVar11 != uVar13);
      }
      uVar8 = bigint::divmod_assign(&local_240,&local_2f0);
      iVar7 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar7) || ((uVar8 & 1) != 0 && iVar7 == 0)) {
        if (uVar8 == 9) {
          buf->ptr_[(int)uVar11] = ':';
          if (num_digits != 1) {
            uVar13 = (ulong)(num_digits - 2);
            do {
              uVar11 = (int)uVar9 - 1;
              uVar9 = (ulong)uVar11;
              if (buf->ptr_[uVar9] != ':') break;
              buf->ptr_[uVar9] = '0';
              buf->ptr_[uVar13] = buf->ptr_[uVar13] + '\x01';
              uVar13 = uVar13 - 1;
            } while (1 < (int)uVar11);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            *exp10 = *exp10 + 1;
          }
          goto LAB_0011ba45;
        }
        uVar8 = uVar8 + 1;
      }
      buf->ptr_[(int)uVar11] = (char)uVar8 + '0';
    }
    goto LAB_0011ba45;
  }
  lhs2 = local_338;
  if (local_338 == (bigint *)0x0) {
    lhs2 = &local_190;
  }
  pcVar5 = buf->ptr_;
  uVar11 = ~(uint)uVar13 & 1;
  lVar14 = 0;
  while( true ) {
    uVar8 = bigint::divmod_assign(&local_240,&local_2f0);
    iVar7 = compare(&local_240,&local_190);
    iVar15 = add_compare(&local_240,lhs2,&local_2f0);
    pcVar5[lVar14] = (char)uVar8 + '0';
    if ((iVar7 < (int)uVar11) || ((int)-uVar11 < iVar15)) break;
    bigint::multiply(&local_240,10);
    bigint::multiply(&local_190,10);
    if (local_338 != (bigint *)0x0) {
      bigint::multiply(local_338,10);
    }
    lVar14 = lVar14 + 1;
  }
  if (iVar7 < (int)uVar11) {
    if ((int)-uVar11 < iVar15) {
      iVar7 = add_compare(&local_240,&local_240,&local_2f0);
      if ((0 < iVar7) || ((uVar8 & 1) != 0 && iVar7 == 0)) {
        cVar6 = pcVar5[lVar14] + '\x01';
        goto LAB_0011b9f0;
      }
    }
  }
  else {
    cVar6 = (char)uVar8 + '1';
LAB_0011b9f0:
    pcVar5[lVar14] = cVar6;
  }
  uVar13 = lVar14 + 1U & 0xffffffff;
  uVar9 = buf->capacity_;
  if (uVar9 < uVar13) {
    (**buf->_vptr_buffer)(buf,uVar13);
    uVar9 = buf->capacity_;
  }
  if (uVar9 < uVar13) {
    uVar13 = uVar9;
  }
  buf->size_ = uVar13;
  *exp10 = *exp10 - (int)lVar14;
LAB_0011ba45:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_e0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_190.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_,
                    local_240.bigits_.super_buffer<unsigned_int>.capacity_ << 2);
  }
  return;
}

Assistant:

void fallback_format(Double d, int num_digits, bool binary32, buffer<char>& buf,
                     int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  fp value;
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  const bool is_predecessor_closer =
      binary32 ? value.assign(static_cast<float>(d)) : value.assign(d);
  int shift = is_predecessor_closer ? 2 : 1;
  uint64_t significand = value.f << shift;
  if (value.e >= 0) {
    numerator.assign(significand);
    numerator <<= value.e;
    lower.assign(1);
    lower <<= value.e;
    if (shift != 1) {
      upper_store.assign(1);
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (shift != 1) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= significand;
    denominator.assign(1);
    denominator <<= shift - value.e;
  } else {
    numerator.assign(significand);
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower.assign(1);
    if (shift != 1) {
      upper_store.assign(1ULL << 1);
      upper = &upper_store;
    }
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (num_digits < 0) {
    // Generate the shortest representation.
    if (!upper) upper = &lower;
    bool even = (value.f & 1) == 0;
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits == 0) {
    buf.try_resize(1);
    denominator *= 10;
    buf[0] = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}